

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv_error.hpp
# Opt level: O2

char * __thiscall jsoncons::conv_error::what(conv_error *this)

{
  string *psVar1;
  string local_30;
  
  psVar1 = &this->what_;
  if ((this->what_)._M_string_length == 0) {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)psVar1);
    if (this->line_number_ == 0) {
      if (this->column_number_ == 0) goto LAB_001dc77e;
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::to_string(&local_30,this->column_number_);
      std::__cxx11::string::append((string *)psVar1);
    }
    else {
      if (this->column_number_ == 0) goto LAB_001dc77e;
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::to_string(&local_30,this->line_number_);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::to_string(&local_30,this->column_number_);
      std::__cxx11::string::append((string *)psVar1);
    }
    std::__cxx11::string::~string((string *)&local_30);
  }
LAB_001dc77e:
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::system_error::what());
                    if (line_number_ != 0 && column_number_ != 0)
                    {
                        what_.append(" at line ");
                        what_.append(std::to_string(line_number_));
                        what_.append(" and column ");
                        what_.append(std::to_string(column_number_));
                    }
                    else if (column_number_ != 0)
                    {
                        what_.append(" at position ");
                        what_.append(std::to_string(column_number_));
                    }
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::system_error::what();
                }
            }